

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_LU(TPZMatrix<std::complex<long_double>_> *this)

{
  complex<long_double> a;
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  TPZBaseMatrix *in_RDI;
  char *in_stack_00000018;
  char *in_stack_00000020;
  int64_t j;
  int64_t i;
  int64_t k;
  int64_t min;
  complex<long_double> pivot;
  complex<long_double> nn;
  complex<long_double> *__y;
  undefined2 uVar8;
  undefined6 uVar9;
  undefined8 in_stack_fffffffffffffe78;
  undefined1 local_148 [32];
  undefined1 local_128 [40];
  long local_100;
  undefined1 local_f8 [72];
  long local_b0;
  complex<long_double> *local_a8 [4];
  complex<long_double> *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  long local_68;
  long local_60;
  complex<long_double> *local_58 [4];
  complex<long_double> local_38;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x01')) {
    Error(in_stack_00000020,in_stack_00000018);
  }
  if (in_RDI->fDecomposed == '\0') {
    std::complex<long_double>::complex(&local_38,(longdouble)0,(longdouble)0);
    std::complex<long_double>::complex((complex<long_double> *)local_58,(longdouble)0,(longdouble)0)
    ;
    iVar5 = TPZBaseMatrix::Cols(in_RDI);
    iVar6 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar5 < iVar6) {
      iVar6 = TPZBaseMatrix::Cols(in_RDI);
    }
    else {
      iVar6 = TPZBaseMatrix::Rows(in_RDI);
    }
    local_60 = iVar6;
    for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_a8,in_RDI,local_68,local_68);
      local_58[0] = local_a8[0];
      local_58[1] = local_a8[1];
      local_58[2] = local_a8[2];
      local_58[3] = local_a8[3];
      local_88 = local_a8[0];
      local_80 = local_a8[1];
      local_78 = local_a8[2];
      local_70 = local_a8[3];
      uVar8 = SUB82(local_a8[1],0);
      uVar9 = (undefined6)((ulong)local_a8[1] >> 0x10);
      a._M_value._8_8_ = iVar5;
      a._M_value._0_8_ = iVar6;
      a._M_value._16_8_ = in_RDI;
      a._M_value._24_8_ = in_stack_fffffffffffffe78;
      __y = local_a8[0];
      bVar4 = IsZero(a);
      lVar1 = local_68;
      if (bVar4) {
        Error(in_stack_00000020,in_stack_00000018);
        lVar1 = local_68;
      }
      while( true ) {
        local_b0 = lVar1 + 1;
        lVar1 = local_b0;
        iVar7 = TPZBaseMatrix::Rows(in_RDI);
        if (iVar7 <= lVar1) break;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_f8,in_RDI,local_b0,local_68);
        std::operator/((complex<long_double> *)CONCAT62(uVar9,uVar8),__y);
        local_38._M_value._0_8_ = local_f8._32_8_;
        local_38._M_value._8_8_ = local_f8._40_8_;
        local_38._M_value._16_8_ = local_f8._48_8_;
        local_38._M_value._24_8_ = local_f8._56_8_;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_b0,local_68,&local_38);
        local_100 = local_68;
        while( true ) {
          local_100 = local_100 + 1;
          lVar2 = local_100;
          iVar7 = TPZBaseMatrix::Cols(in_RDI);
          lVar1 = local_b0;
          lVar3 = local_100;
          if (iVar7 <= lVar2) break;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_148,in_RDI,local_b0,local_100);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (&stack0xfffffffffffffe78,in_RDI,local_68,local_100);
          std::operator*((complex<long_double> *)CONCAT62(uVar9,uVar8),__y);
          std::operator-((complex<long_double> *)CONCAT62(uVar9,uVar8),__y);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar3,local_128);
        }
      }
    }
    in_RDI->fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}